

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix_test.cc
# Opt level: O1

void __thiscall
leveldb::EnvPosixTest_TestCloseOnExecRandomAccessFile_Test::TestBody
          (EnvPosixTest_TestCloseOnExecRandomAccessFile_Test *this)

{
  Env *pEVar1;
  size_t sVar2;
  int line;
  int i;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *this_00;
  undefined8 *puVar3;
  pointer *__ptr;
  char *pcVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *message;
  long lVar5;
  AssertionResult gtest_ar_2;
  RandomAccessFile *file;
  string file_path;
  RandomAccessFile *mmapped_files [4];
  string test_dir;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> open_fds;
  Slice local_f8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  EnvPosixTest_TestCloseOnExecRandomAccessFile_Test *local_d8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  string local_c8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  undefined8 *puStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  anon_unknown.dwarf_f564::GetOpenFileDescriptors
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &local_68);
  local_88 = local_78;
  local_80 = 0;
  local_78[0] = 0;
  pEVar1 = (this->super_EnvPosixTest).env_;
  local_d8 = this;
  (*pEVar1->_vptr_Env[0x13])(&local_a8,pEVar1,&local_88);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c8,
             (char *)&local_f8,(Status *)"env_->GetTestDirectory(&test_dir)");
  if (local_a8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_a8._M_head_impl);
  }
  if ((char)local_c8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_string_length ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
               ,0xef,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._M_head_impl + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_string_length ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_0010b82f;
    if (*(char **)local_c8._M_string_length != (char *)(local_c8._M_string_length + 0x10)) {
      operator_delete(*(char **)local_c8._M_string_length);
    }
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_string_length !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      if (*(char **)local_c8._M_string_length != (char *)(local_c8._M_string_length + 0x10)) {
        operator_delete(*(char **)local_c8._M_string_length);
      }
      operator_delete((void *)local_c8._M_string_length);
    }
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_88,local_88 + local_80);
    std::__cxx11::string::append((char *)&local_c8);
    local_f8.data_ = "0123456789";
    local_f8.size_ = (size_t)&DAT_0000000a;
    WriteStringToFile((leveldb *)&local_e0,(local_d8->super_EnvPosixTest).env_,&local_f8,&local_c8);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_a8,
               (char *)&local_e8,(Status *)"WriteStringToFile(env_, \"0123456789\", file_path)");
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete__(local_e0._M_head_impl);
    }
    if (local_a8._M_head_impl._0_1_ ==
        (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&local_f8);
      if (puStack_a0 == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (char *)*puStack_a0;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
                 ,0xf1,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
      puVar3 = puStack_a0;
      if ((long *)local_f8.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_f8.data_ + 8))();
        puVar3 = puStack_a0;
      }
    }
    else {
      if (puStack_a0 != (undefined8 *)0x0) {
        if ((undefined8 *)*puStack_a0 != puStack_a0 + 2) {
          operator_delete((undefined8 *)*puStack_a0);
        }
        operator_delete(puStack_a0);
      }
      local_98 = 0;
      uStack_90 = 0;
      local_a8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      puStack_a0 = (undefined8 *)0x0;
      lVar5 = 0;
      do {
        pEVar1 = (local_d8->super_EnvPosixTest).env_;
        (*pEVar1->_vptr_Env[3])(&local_e0,pEVar1,&local_c8,(long)&local_a8._M_head_impl + lVar5);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_f8,
                   (char *)&local_e8,
                   (Status *)"env_->NewRandomAccessFile(file_path, &mmapped_files[i])");
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_e0._M_head_impl);
        }
        sVar2 = local_f8.size_;
        if ((char)local_f8.data_ == '\0') {
          testing::Message::Message((Message *)&local_e0);
          if ((undefined8 *)local_f8.size_ == (undefined8 *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)local_f8.size_;
          }
          this_00 = &local_e8;
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
                     ,0xf8,pcVar4);
          message = &local_e0;
          goto LAB_0010b7dc;
        }
        if ((undefined8 *)local_f8.size_ != (undefined8 *)0x0) {
          if (*(undefined8 **)local_f8.size_ != (undefined8 *)(local_f8.size_ + 0x10)) {
            operator_delete(*(undefined8 **)local_f8.size_);
          }
          operator_delete((void *)sVar2);
        }
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x20);
      local_e0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pEVar1 = (local_d8->super_EnvPosixTest).env_;
      (*pEVar1->_vptr_Env[3])(&local_e8,pEVar1,&local_c8);
      testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_f8,
                 (char *)&local_d0,(Status *)"env_->NewRandomAccessFile(file_path, &file)");
      if (local_e8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete__(local_e8._M_head_impl);
      }
      sVar2 = local_f8.size_;
      if ((char)local_f8.data_ == '\0') {
        testing::Message::Message((Message *)&local_e8);
        if ((undefined8 *)local_f8.size_ == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_f8.size_;
        }
        line = 0xfc;
      }
      else {
        if ((undefined8 *)local_f8.size_ != (undefined8 *)0x0) {
          if (*(undefined8 **)local_f8.size_ != (undefined8 *)(local_f8.size_ + 0x10)) {
            operator_delete(*(undefined8 **)local_f8.size_);
          }
          operator_delete((void *)sVar2);
        }
        anon_unknown.dwarf_f564::CheckCloseOnExecDoesNotLeakFDs
                  ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   &local_68);
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
        lVar5 = 0;
        do {
          if ((&local_a8)[lVar5]._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)(&local_a8)[lVar5]._M_head_impl + 8))();
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        pEVar1 = (local_d8->super_EnvPosixTest).env_;
        (*pEVar1->_vptr_Env[8])(&local_e8,pEVar1,&local_c8);
        testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                  ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_f8,
                   (char *)&local_d0,(Status *)"env_->RemoveFile(file_path)");
        if (local_e8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          operator_delete__(local_e8._M_head_impl);
        }
        puVar3 = (undefined8 *)local_f8.size_;
        if ((char)local_f8.data_ != '\0') goto LAB_0010b802;
        testing::Message::Message((Message *)&local_e8);
        if ((undefined8 *)local_f8.size_ == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_f8.size_;
        }
        line = 0x103;
      }
      this_00 = &local_d0;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/env_posix_test.cc"
                 ,line,pcVar4);
      message = &local_e8;
LAB_0010b7dc:
      testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      puVar3 = (undefined8 *)local_f8.size_;
      if (message->_M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)message->_M_head_impl + 8))();
        puVar3 = (undefined8 *)local_f8.size_;
      }
    }
LAB_0010b802:
    if (puVar3 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar3 != puVar3 + 2) {
        operator_delete((undefined8 *)*puVar3);
      }
      operator_delete(puVar3);
    }
    local_c8._M_string_length = (size_type)local_c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto LAB_0010b82f;
  }
  operator_delete((void *)local_c8._M_string_length);
LAB_0010b82f:
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

TEST_F(EnvPosixTest, TestCloseOnExecRandomAccessFile) {
  std::unordered_set<int> open_fds;
  GetOpenFileDescriptors(&open_fds);

  std::string test_dir;
  ASSERT_LEVELDB_OK(env_->GetTestDirectory(&test_dir));
  std::string file_path = test_dir + "/close_on_exec_random_access.txt";
  ASSERT_LEVELDB_OK(WriteStringToFile(env_, "0123456789", file_path));

  // Exhaust the RandomAccessFile mmap limit. This way, the test
  // RandomAccessFile instance below is backed by a file descriptor, not by an
  // mmap region.
  leveldb::RandomAccessFile* mmapped_files[kReadOnlyFileLimit] = {nullptr};
  for (int i = 0; i < kReadOnlyFileLimit; i++) {
    ASSERT_LEVELDB_OK(env_->NewRandomAccessFile(file_path, &mmapped_files[i]));
  }

  leveldb::RandomAccessFile* file = nullptr;
  ASSERT_LEVELDB_OK(env_->NewRandomAccessFile(file_path, &file));
  CheckCloseOnExecDoesNotLeakFDs(open_fds);
  delete file;

  for (int i = 0; i < kReadOnlyFileLimit; i++) {
    delete mmapped_files[i];
  }
  ASSERT_LEVELDB_OK(env_->RemoveFile(file_path));
}